

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool bradford_check(double a,double b,double c)

{
  double c_local;
  double b_local;
  double a_local;
  
  if (a < b) {
    if (0.0 < c) {
      a_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"BRADFORD_CHECK - Warning!\n");
      std::operator<<((ostream *)&std::cerr,"  C <= 0.\n");
      a_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"BRADFORD_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  B <= A.\n");
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool bradford_check ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_CHECK checks the parameters of the Bradford PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, bool BRADFORD_CHECK, is true if the parameters are legal.
//
{
  if ( b <= a )
  {
    cerr << " \n";
    cerr << "BRADFORD_CHECK - Warning!\n";
    cerr << "  B <= A.\n";
    return false;
  }

  if ( c <= 0.0 )
  {
    cerr << " \n";
    cerr << "BRADFORD_CHECK - Warning!\n";
    cerr << "  C <= 0.\n";
    return false;
  }

  return true;
}